

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::looksLikeNumber(string *string,size_t index)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool local_1;
  
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  if (in_RSI < sVar2) {
    pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_RDI,in_RSI);
    bVar1 = isDigitCharacter(*pvVar3);
    if (bVar1) {
      local_1 = true;
    }
    else {
      sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(in_RDI);
      if (sVar2 < in_RSI + 2) {
        local_1 = false;
      }
      else {
        pvVar3 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_RDI,in_RSI);
        if (((*pvVar3 == '.') &&
            (pvVar3 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                (in_RDI,in_RSI), '/' < *pvVar3)) &&
           (pvVar3 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (in_RDI,in_RSI), *pvVar3 < ':')) {
          local_1 = true;
        }
        else {
          pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (in_RDI,in_RSI);
          if ((*pvVar3 == '-') ||
             (pvVar3 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (in_RDI,in_RSI), *pvVar3 == '+')) {
            pvVar3 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (in_RDI,in_RSI);
            if (('/' < *pvVar3) &&
               (pvVar3 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[](in_RDI,in_RSI), *pvVar3 < ':')) {
              return true;
            }
            sVar2 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(in_RDI);
            if (((in_RSI + 3 <= sVar2) &&
                (pvVar3 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          operator[](in_RDI,in_RSI), *pvVar3 == '.')) &&
               ((pvVar3 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          operator[](in_RDI,in_RSI), '/' < *pvVar3 &&
                (pvVar3 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          operator[](in_RDI,in_RSI), *pvVar3 < ':')))) {
              return true;
            }
          }
          local_1 = false;
        }
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool looksLikeNumber(const std::string& string, size_t index)
{
    if (string.size() <= index) {
        return false;
    }
    if (isDigitCharacter(string[index])) {
        return true;
    }
    if (string.size() < index + 2) {
        return false;
    }
    if (string[index] == '.' &&
        (string[index + 1] >= '0' && string[index + 1] <= '9')) {
        return true;
    }
    if (string[index] == '-' || string[index] == '+') {
        if (string[index + 1] >= '0' && string[index + 1] <= '9') {
            return true;
        }
        if (string.size() >= index + 3 && string[index + 1] == '.' &&
            (string[index + 2] >= '0' && string[index + 2] <= '9')) {
            return true;
        }
    }
    return false;
}